

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_matrix.h
# Opt level: O2

_matrix<float> * __thiscall
xray_re::_matrix<float>::set_hpb(_matrix<float> *this,float h,float p,float b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = sinf(h);
  fVar2 = cosf(h);
  fVar3 = sinf(p);
  fVar4 = cosf(p);
  fVar5 = sinf(b);
  fVar6 = cosf(b);
  (this->field_0).field_0._11 = fVar2 * fVar6 - fVar5 * fVar1 * fVar3;
  (this->field_0).field_0._12 = fVar5 * -fVar4;
  (this->field_0).field_0._13 = fVar2 * fVar5 * fVar3 + fVar1 * fVar6;
  (this->field_0).field_0._14 = 0.0;
  (this->field_0).field_0._21 = fVar1 * fVar3 * fVar6 + fVar2 * fVar5;
  (this->field_0).field_0._22 = fVar4 * fVar6;
  (this->field_0).field_0._23 = fVar5 * fVar1 - fVar2 * fVar3 * fVar6;
  (this->field_0).field_0._24 = 0.0;
  (this->field_0).field_0._31 = -fVar4 * fVar1;
  (this->field_0).field_0._32 = fVar3;
  (this->field_0).field_0._33 = fVar2 * fVar4;
  *(undefined8 *)((long)&this->field_0 + 0x2c) = 0;
  *(undefined8 *)((long)&this->field_0 + 0x34) = 0;
  (this->field_0).field_0._44 = 1.0;
  return this;
}

Assistant:

inline _matrix<T>& _matrix<T>::set_hpb(T h, T p, T b)
{
	T sh = std::sin(h);
	T ch = std::cos(h);
	T sp = std::sin(p);
	T cp = std::cos(p);
	T sb = std::sin(b);
	T cb = std::cos(b);

#if 1
	_11 = ch*cb - sh*sp*sb;
	_12 = -cp*sb;
	_13 = ch*sb*sp + sh*cb;
	_14 = 0;

	_21 = sp*sh*cb + ch*sb;
	_22 = cb*cp;
	_23 = sh*sb - sp*ch*cb;
	_24 = 0;

	_31 = -cp*sh;
	_32 = sp;
	_33 = ch*cp;
	_34 = 0;

	_41 = 0;
	_42 = 0;
	_43 = 0;
	_44 = T(1);
#else
	i.set(ch*cb - sh*sp*sb, -cp*sb, ch*sb*sp + sh*cb); _14 = 0;
	j.set(sp*sh*cb + ch*sb, cb*cp, sh*sb - sp*ch*cb); _24 = 0;
	k.set(-cp*sh, sp, ch*cp); _34 = 0;
	c.set(0, 0, 0); _44 = T(1);
#endif

	return *this;
}